

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::SetStopTime(cmCTest *this,string *time_str)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  undefined8 uVar5;
  pointer pPVar6;
  int local_474;
  duration<long,_std::ratio<3600L,_1L>_> local_470;
  duration local_468;
  duration local_460;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_458;
  time_t local_450;
  time_t stop_time;
  char buf [1024];
  int local_40;
  int tzone_offset;
  int local_hour;
  time_t gm_time;
  time_t tStack_28;
  int gm_hour;
  time_t current_time;
  tm *lctime;
  string *time_str_local;
  cmCTest *this_local;
  
  lctime = (tm *)time_str;
  time_str_local = (string *)this;
  tStack_28 = time((time_t *)0x0);
  current_time = (time_t)gmtime(&stack0xffffffffffffffd8);
  iVar1 = ((tm *)current_time)->tm_hour;
  tVar4 = mktime((tm *)current_time);
  current_time = (time_t)localtime(&stack0xffffffffffffffd8);
  iVar2 = ((tm *)current_time)->tm_hour;
  local_40 = iVar2 - iVar1;
  if ((tStack_28 < tVar4) && (iVar1 < iVar2)) {
    local_40 = local_40 + -0x18;
  }
  else if ((tVar4 < tStack_28) && (iVar2 < iVar1)) {
    local_40 = local_40 + 0x18;
  }
  iVar1 = ((tm *)current_time)->tm_year;
  iVar2 = ((tm *)current_time)->tm_mon;
  uVar3 = ((tm *)current_time)->tm_mday;
  uVar5 = std::__cxx11::string::c_str();
  snprintf((char *)&stop_time,0x400,"%d%02d%02d %s %+05i",(ulong)(iVar1 + 0x76c),(ulong)(iVar2 + 1),
           (ulong)uVar3,uVar5,local_40 * 100);
  local_450 = curl_getdate((char *)&stop_time,&stack0xffffffffffffffd8);
  if (local_450 == -1) {
    std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(&local_458);
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    (pPVar6->StopTime).__d.__r = (rep)local_458.__d.__r;
  }
  else {
    local_460.__r = (rep)std::chrono::_V2::system_clock::from_time_t(local_450);
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    (pPVar6->StopTime).__d.__r = local_460.__r;
    if (local_450 < tStack_28) {
      local_474 = 0x18;
      std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                ((duration<long,std::ratio<3600l,1l>> *)&local_470,&local_474);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<3600l,1l>,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_468,&local_470);
      pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=(&pPVar6->StopTime,&local_468);
    }
  }
  return;
}

Assistant:

void cmCTest::SetStopTime(std::string const& time_str)
{

  struct tm* lctime;
  time_t current_time = time(nullptr);
  lctime = gmtime(&current_time);
  int gm_hour = lctime->tm_hour;
  time_t gm_time = mktime(lctime);
  lctime = localtime(&current_time);
  int local_hour = lctime->tm_hour;

  int tzone_offset = local_hour - gm_hour;
  if (gm_time > current_time && gm_hour < local_hour) {
    // this means gm_time is on the next day
    tzone_offset -= 24;
  } else if (gm_time < current_time && gm_hour > local_hour) {
    // this means gm_time is on the previous day
    tzone_offset += 24;
  }

  tzone_offset *= 100;
  char buf[1024];
  snprintf(buf, sizeof(buf), "%d%02d%02d %s %+05i", lctime->tm_year + 1900,
           lctime->tm_mon + 1, lctime->tm_mday, time_str.c_str(),
           tzone_offset);

  time_t stop_time = curl_getdate(buf, &current_time);
  if (stop_time == -1) {
    this->Impl->StopTime = std::chrono::system_clock::time_point();
    return;
  }
  this->Impl->StopTime = std::chrono::system_clock::from_time_t(stop_time);

  if (stop_time < current_time) {
    this->Impl->StopTime += std::chrono::hours(24);
  }
}